

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

double getParaDescent(DoublePerlinNoise *para,double factor,int x,int z,int w,int h,int i0,int j0,
                     int maxrad,int maxiter,double alpha,void *data,
                     _func_int_void_ptr_int_int_double *func)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  double in_stack_00000020;
  code *in_stack_00000028;
  int c;
  double va;
  double vd;
  double v;
  int j;
  int i;
  int k;
  int dira;
  int dirz;
  int dirx;
  double in_stack_fffffffffffffef8;
  code *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  double local_d0;
  double local_98;
  uint local_6c;
  double local_60;
  double local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  
  local_3c = 0;
  local_40 = 0;
  local_58 = sampleDoublePerlin((DoublePerlinNoise *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                in_stack_fffffffffffffef8);
  local_58 = in_XMM0_Qa * local_58;
  if (in_stack_00000028 != (code *)0x0) {
    local_98 = local_58;
    if (in_XMM0_Qa < 0.0) {
      local_98 = -local_58;
    }
    iVar1 = (*in_stack_00000028)
                      (local_98,in_stack_00000020,in_ESI + in_R9D,in_EDX + in_stack_00000008);
    if (iVar1 != 0) {
      dVar3 = nan("");
      return dVar3;
    }
  }
  local_50 = in_stack_00000008;
  local_48 = 0;
  local_4c = in_R9D;
  do {
    if (in_stack_00000018 <= local_48) {
      return local_58;
    }
    if (local_3c == 0) {
      local_3c = 1;
    }
    if ((local_4c + local_3c < 0) || (in_ECX <= local_4c + local_3c)) {
      local_60 = local_58;
    }
    else {
      local_60 = sampleDoublePerlin((DoublePerlinNoise *)
                                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                    in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                    in_stack_fffffffffffffef8);
      local_60 = in_XMM0_Qa * local_60;
    }
    if (local_58 <= local_60) {
      local_3c = -local_3c;
      if ((local_4c + local_3c < 0) || (in_ECX <= local_4c + local_3c)) {
        local_60 = local_58;
      }
      else {
        local_60 = sampleDoublePerlin((DoublePerlinNoise *)
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                      in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                      in_stack_fffffffffffffef8);
        local_60 = in_XMM0_Qa * local_60;
      }
      if (local_58 <= local_60) {
        local_3c = 0;
      }
    }
    if (local_3c != 0) {
      iVar1 = (int)((double)local_3c * in_XMM1_Qa * (local_58 - local_60));
      iVar2 = iVar1;
      if (iVar1 < 1) {
        iVar2 = -iVar1;
      }
      if (((iVar2 < 3) || (local_4c + iVar1 < 0)) || (in_ECX <= local_4c + iVar1)) {
LAB_0011952f:
        local_58 = local_60;
        iVar1 = local_3c;
      }
      else {
        local_58 = sampleDoublePerlin((DoublePerlinNoise *)
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                      in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                      in_stack_fffffffffffffef8);
        local_58 = in_XMM0_Qa * local_58;
        if (local_60 <= local_58) goto LAB_0011952f;
      }
      local_4c = iVar1 + local_4c;
      if (in_stack_00000028 != (code *)0x0) {
        if (0.0 <= in_XMM0_Qa) {
          local_d0 = local_58;
        }
        else {
          local_d0 = -local_58;
        }
        iVar1 = (*in_stack_00000028)(local_d0,in_stack_00000020,in_ESI + local_4c,in_EDX + local_50)
        ;
        if (iVar1 != 0) {
          dVar3 = nan("");
          return dVar3;
        }
      }
    }
    if (local_40 == 0) {
      local_40 = 1;
    }
    if ((local_50 + local_40 < 0) || (in_R8D <= local_50 + local_40)) {
      local_60 = local_58;
    }
    else {
      local_60 = sampleDoublePerlin((DoublePerlinNoise *)
                                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                    in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                    in_stack_fffffffffffffef8);
      local_60 = in_XMM0_Qa * local_60;
    }
    if (local_58 <= local_60) {
      local_40 = -local_40;
      if ((local_50 + local_40 < 0) || (in_R8D <= local_50 + local_40)) {
        local_60 = local_58;
      }
      else {
        local_60 = sampleDoublePerlin((DoublePerlinNoise *)
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                      in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                      in_stack_fffffffffffffef8);
        local_60 = in_XMM0_Qa * local_60;
      }
      if (local_58 <= local_60) {
        local_40 = 0;
      }
    }
    if (local_40 != 0) {
      iVar1 = (int)((double)local_40 * in_XMM1_Qa * (local_58 - local_60));
      iVar2 = iVar1;
      if (iVar1 < 1) {
        iVar2 = -iVar1;
      }
      if (((iVar2 < 3) || (local_50 + iVar1 < 0)) || (in_R8D <= local_50 + iVar1)) {
LAB_001198eb:
        local_58 = local_60;
        iVar1 = local_40;
      }
      else {
        local_58 = sampleDoublePerlin((DoublePerlinNoise *)
                                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                      in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                      in_stack_fffffffffffffef8);
        local_58 = in_XMM0_Qa * local_58;
        if (local_60 <= local_58) goto LAB_001198eb;
      }
      local_50 = iVar1 + local_50;
      if (in_stack_00000028 != (code *)0x0) {
        in_stack_ffffffffffffff10 = in_ESI + local_4c;
        in_stack_ffffffffffffff14 = in_EDX + local_50;
        in_stack_fffffffffffffef8 = local_58;
        if (in_XMM0_Qa < 0.0) {
          in_stack_fffffffffffffef8 = -local_58;
        }
        in_stack_ffffffffffffff00 = in_stack_00000028;
        in_stack_ffffffffffffff08 = in_stack_00000020;
        iVar1 = (*in_stack_00000028)
                          (in_stack_fffffffffffffef8,in_stack_00000020,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff14);
        if (iVar1 != 0) {
          dVar3 = nan("");
          return dVar3;
        }
      }
    }
    if ((local_3c == 0) && (local_40 == 0)) {
      for (local_6c = 0; (int)local_6c < 4; local_6c = local_6c + 1) {
        local_3c = 1;
        if ((local_6c & 1) != 0) {
          local_3c = -1;
        }
        local_40 = 1;
        if ((local_6c & 2) != 0) {
          local_40 = -1;
        }
        if (((-1 < local_4c + local_3c) && (local_4c + local_3c < in_ECX)) &&
           ((-1 < local_50 + local_40 && (local_50 + local_40 < in_R8D)))) {
          dVar3 = sampleDoublePerlin((DoublePerlinNoise *)
                                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                     in_stack_ffffffffffffff08,(double)in_stack_ffffffffffffff00,
                                     in_stack_fffffffffffffef8);
          if (in_XMM0_Qa * dVar3 < local_58) {
            local_4c = local_3c + local_4c;
            local_50 = local_40 + local_50;
            local_58 = in_XMM0_Qa * dVar3;
            break;
          }
        }
      }
      if (3 < (int)local_6c) {
        return local_58;
      }
    }
    iVar1 = local_4c - in_R9D;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (in_stack_00000010 < iVar1) {
      return local_58;
    }
    iVar1 = local_50 - in_stack_00000008;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (in_stack_00000010 < iVar1) {
      return local_58;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

double getParaDescent(const DoublePerlinNoise *para, double factor,
    int x, int z, int w, int h, int i0, int j0, int maxrad,
    int maxiter, double alpha, void *data, int (*func)(void*,int,int,double))
{
    /// Do a gradient descent on a grid...
    /// To start with, we will just consider a step size of 1 in one axis:
    ///   Try going in positive x: if gradient is upwards go to negative x
    ///   then do the same with z - if all 4 directions go upwards then we have
    ///   found a minimum, otherwise repeat.
    /// We can remember and try the direction from the previous cycle first to
    /// reduce the number of wrong guesses.
    ///
    /// We can also use a larger step size than 1, as long as we believe that
    /// the minimum is not in between. To determine if this is viable, we check
    /// the step size of 1 first, and then jump if the gradient appears large
    /// enough in that direction.
    ///
    ///TODO:
    /// The perlin noise can be sampled continuously, so more established
    /// minima algorithms can also be considered...

    int dirx = 0, dirz = 0, dira;
    int k, i, j;
    double v, vd, va;
    v = factor * sampleDoublePerlin(para, x+i0, 0, z+j0);
    if (func)
    {
        if (func(data, x+i0, z+j0, factor < 0 ? -v : v))
            return nan("");
    }

    i = i0; j = j0;
    for (k = 0; k < maxiter; k++)
    {
        if (dirx == 0) dirx = +1;
        if (i+dirx >= 0 && i+dirx < w)
            vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
        else vd = v;
        if (vd >= v)
        {
            dirx *= -1;
            if (i+dirx >= 0 && i+dirx < w)
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
            else vd = v;
            if (vd >= v)
                dirx = 0;
        }
        if (dirx)
        {
            dira = (int)(dirx * alpha * (v - vd));
            if (abs(dira) > 2 && i+dira >= 0 && i+dira < w)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i+dira, 0, z+j);
                if (va < vd)
                {
                    i += dira;
                    v = va;
                    goto L_x_end;
                }
            }
            v = vd;
            i += dirx;
        L_x_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }

        if (dirz == 0) dirz = +1;
        if (j+dirz >= 0 && j+dirz < h)
            vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
        else vd = v;
        if (vd >= v)
        {
            dirz *= -1;
            if (j+dirz >= 0 && j+dirz < h)
                vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
            else vd = v;
            if (vd >= v)
                dirz = 0;
        }
        if (dirz)
        {
            dira = (int)(dirz * alpha * (v - vd));
            if (abs(dira) > 2 && j+dira >= 0 && j+dira < h)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i, 0, z+j+dira);
                if (va < vd)
                {
                    j += dira;
                    v = va;
                    goto L_z_end;
                }
            }
            j += dirz;
            v = vd;
        L_z_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }
        if (dirx == 0 && dirz == 0)
        {   // this is very likely a fix point
            // but there could be a minimum along a diagonal path in rare cases
            int c;
            for (c = 0; c < 4; c++)
            {
                dirx = (c & 1) ? -1 : +1;
                dirz = (c & 2) ? -1 : +1;
                if (i+dirx < 0 || i+dirx >= w || j+dirz < 0 || j+dirz >= h)
                    continue;
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j+dirz);
                if (vd < v)
                {
                    v = vd;
                    i += dirx;
                    j += dirz;
                    break;
                }
            }
            if (c >= 4)
                break;
        }
        if (abs(i - i0) > maxrad || abs(j - j0) > maxrad)
            break; // we have gone too far from the origin
    }

    return v;
}